

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Bool
ft_cubic_is_small_enough
          (PVG_FT_Vector *base,PVG_FT_Angle *angle_in,PVG_FT_Angle *angle_mid,
          PVG_FT_Angle *angle_out)

{
  long dx;
  long dy;
  long dx_00;
  long dy_00;
  long dx_01;
  long dy_01;
  PVG_FT_Angle PVar1;
  PVG_FT_Pos PVar2;
  PVG_FT_Pos PVar3;
  bool local_7b;
  bool local_7a;
  bool local_78;
  bool local_76;
  PVG_FT_Int close3;
  PVG_FT_Int close2;
  PVG_FT_Int close1;
  PVG_FT_Angle theta2;
  PVG_FT_Angle theta1;
  PVG_FT_Vector d3;
  PVG_FT_Vector d2;
  PVG_FT_Vector d1;
  PVG_FT_Angle *angle_out_local;
  PVG_FT_Angle *angle_mid_local;
  PVG_FT_Angle *angle_in_local;
  PVG_FT_Vector *base_local;
  
  dx = base[2].x - base[3].x;
  dy = base[2].y - base[3].y;
  dx_00 = base[1].x - base[2].x;
  dy_00 = base[1].y - base[2].y;
  dx_01 = base->x - base[1].x;
  dy_01 = base->y - base[1].y;
  local_76 = false;
  if ((-2 < dx) && (local_76 = false, dx < 2)) {
    local_76 = -2 < dy && dy < 2;
  }
  local_78 = false;
  if ((-2 < dx_00) && (local_78 = false, dx_00 < 2)) {
    local_78 = -2 < dy_00 && dy_00 < 2;
  }
  local_7a = false;
  if ((-2 < dx_01) && (local_7a = false, dx_01 < 2)) {
    local_7a = -2 < dy_01 && dy_01 < 2;
  }
  if (local_76) {
    if (local_78) {
      if (!local_7a) {
        PVar1 = PVG_FT_Atan2(dx_01,dy_01);
        *angle_out = PVar1;
        *angle_mid = PVar1;
        *angle_in = PVar1;
      }
    }
    else if (local_7a) {
      PVar1 = PVG_FT_Atan2(dx_00,dy_00);
      *angle_out = PVar1;
      *angle_mid = PVar1;
      *angle_in = PVar1;
    }
    else {
      PVar1 = PVG_FT_Atan2(dx_00,dy_00);
      *angle_mid = PVar1;
      *angle_in = PVar1;
      PVar1 = PVG_FT_Atan2(dx_01,dy_01);
      *angle_out = PVar1;
    }
  }
  else if (local_78) {
    if (local_7a) {
      PVar1 = PVG_FT_Atan2(dx,dy);
      *angle_out = PVar1;
      *angle_mid = PVar1;
      *angle_in = PVar1;
    }
    else {
      PVar1 = PVG_FT_Atan2(dx,dy);
      *angle_in = PVar1;
      PVar1 = PVG_FT_Atan2(dx_01,dy_01);
      *angle_out = PVar1;
      PVar1 = ft_angle_mean(*angle_in,*angle_out);
      *angle_mid = PVar1;
    }
  }
  else if (local_7a) {
    PVar1 = PVG_FT_Atan2(dx,dy);
    *angle_in = PVar1;
    PVar1 = PVG_FT_Atan2(dx_00,dy_00);
    *angle_out = PVar1;
    *angle_mid = PVar1;
  }
  else {
    PVar1 = PVG_FT_Atan2(dx,dy);
    *angle_in = PVar1;
    PVar1 = PVG_FT_Atan2(dx_00,dy_00);
    *angle_mid = PVar1;
    PVar1 = PVG_FT_Atan2(dx_01,dy_01);
    *angle_out = PVar1;
  }
  PVar1 = PVG_FT_Angle_Diff(*angle_in,*angle_mid);
  PVar2 = ft_pos_abs(PVar1);
  PVar1 = PVG_FT_Angle_Diff(*angle_mid,*angle_out);
  PVar3 = ft_pos_abs(PVar1);
  local_7b = PVar2 < 0x168000 && PVar3 < 0x168000;
  return local_7b;
}

Assistant:

static PVG_FT_Bool ft_cubic_is_small_enough(PVG_FT_Vector* base,
                                           PVG_FT_Angle*  angle_in,
                                           PVG_FT_Angle*  angle_mid,
                                           PVG_FT_Angle*  angle_out)
{
    PVG_FT_Vector d1, d2, d3;
    PVG_FT_Angle  theta1, theta2;
    PVG_FT_Int    close1, close2, close3;

    d1.x = base[2].x - base[3].x;
    d1.y = base[2].y - base[3].y;
    d2.x = base[1].x - base[2].x;
    d2.y = base[1].y - base[2].y;
    d3.x = base[0].x - base[1].x;
    d3.y = base[0].y - base[1].y;

    close1 = PVG_FT_IS_SMALL(d1.x) && PVG_FT_IS_SMALL(d1.y);
    close2 = PVG_FT_IS_SMALL(d2.x) && PVG_FT_IS_SMALL(d2.y);
    close3 = PVG_FT_IS_SMALL(d3.x) && PVG_FT_IS_SMALL(d3.y);

    if (close1) {
        if (close2) {
            if (close3) {
                /* basically a point;                      */
                /* do nothing to retain original direction */
            } else /* !close3 */
            {
                *angle_in = *angle_mid = *angle_out = PVG_FT_Atan2(d3.x, d3.y);
            }
        } else /* !close2 */
        {
            if (close3) {
                *angle_in = *angle_mid = *angle_out = PVG_FT_Atan2(d2.x, d2.y);
            } else /* !close3 */
            {
                *angle_in = *angle_mid = PVG_FT_Atan2(d2.x, d2.y);
                *angle_out = PVG_FT_Atan2(d3.x, d3.y);
            }
        }
    } else /* !close1 */
    {
        if (close2) {
            if (close3) {
                *angle_in = *angle_mid = *angle_out = PVG_FT_Atan2(d1.x, d1.y);
            } else /* !close3 */
            {
                *angle_in = PVG_FT_Atan2(d1.x, d1.y);
                *angle_out = PVG_FT_Atan2(d3.x, d3.y);
                *angle_mid = ft_angle_mean(*angle_in, *angle_out);
            }
        } else /* !close2 */
        {
            if (close3) {
                *angle_in = PVG_FT_Atan2(d1.x, d1.y);
                *angle_mid = *angle_out = PVG_FT_Atan2(d2.x, d2.y);
            } else /* !close3 */
            {
                *angle_in = PVG_FT_Atan2(d1.x, d1.y);
                *angle_mid = PVG_FT_Atan2(d2.x, d2.y);
                *angle_out = PVG_FT_Atan2(d3.x, d3.y);
            }
        }
    }

    theta1 = ft_pos_abs(PVG_FT_Angle_Diff(*angle_in, *angle_mid));
    theta2 = ft_pos_abs(PVG_FT_Angle_Diff(*angle_mid, *angle_out));

    return PVG_FT_BOOL(theta1 < PVG_FT_SMALL_CUBIC_THRESHOLD &&
                      theta2 < PVG_FT_SMALL_CUBIC_THRESHOLD);
}